

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

void __thiscall
pbrt::SimplePathIntegrator::SimplePathIntegrator
          (SimplePathIntegrator *this,int maxDepth,bool sampleLights,bool sampleBSDF,
          CameraHandle *camera,SamplerHandle *sampler,PrimitiveHandle *aggregate,
          vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *lights)

{
  span<const_pbrt::LightHandle> lights_00;
  byte in_CL;
  byte in_DL;
  undefined4 in_ESI;
  Allocator in_RDI;
  polymorphic_allocator<std::byte> *in_R8;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *in_R9;
  span<const_pbrt::LightHandle> *in_stack_00000008;
  UniformLightSampler *in_stack_00000010;
  SamplerHandle *in_stack_ffffffffffffff38;
  LightHandle *pLVar1;
  undefined1 *puVar2;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *in_stack_ffffffffffffff88;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *in_stack_ffffffffffffff90;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *in_stack_ffffffffffffffb0;
  PrimitiveHandle *in_stack_ffffffffffffffb8;
  SamplerHandle *in_stack_ffffffffffffffc0;
  CameraHandle *in_stack_ffffffffffffffc8;
  RayIntegrator *in_stack_ffffffffffffffd0;
  LightHandle local_28 [3];
  byte local_e;
  byte local_d;
  undefined4 local_c;
  
  local_d = in_DL & 1;
  local_e = in_CL & 1;
  pLVar1 = local_28;
  local_c = in_ESI;
  CameraHandle::CameraHandle((CameraHandle *)in_R8,(CameraHandle *)in_stack_ffffffffffffff38);
  puVar2 = &stack0xffffffffffffffd0;
  SamplerHandle::SamplerHandle((SamplerHandle *)in_R8,in_stack_ffffffffffffff38);
  PrimitiveHandle::PrimitiveHandle
            ((PrimitiveHandle *)in_R8,(PrimitiveHandle *)in_stack_ffffffffffffff38);
  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  RayIntegrator::RayIntegrator
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::~vector
            ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)in_stack_00000008);
  (in_RDI.memoryResource)->_vptr_memory_resource = (_func_int **)&PTR__SimplePathIntegrator_0350e3c0
  ;
  *(undefined4 *)&in_RDI.memoryResource[0xd]._vptr_memory_resource = local_c;
  *(byte *)((long)&in_RDI.memoryResource[0xd]._vptr_memory_resource + 4) = local_d & 1;
  *(byte *)((long)&in_RDI.memoryResource[0xd]._vptr_memory_resource + 5) = local_e & 1;
  pstd::span<pbrt::LightHandle_const>::
  span<std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>,void,std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>>
            (in_stack_00000008,in_R9);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator(in_R8);
  lights_00.n = (size_t)puVar2;
  lights_00.ptr = pLVar1;
  UniformLightSampler::UniformLightSampler(in_stack_00000010,lights_00,in_RDI);
  return;
}

Assistant:

SimplePathIntegrator::SimplePathIntegrator(int maxDepth, bool sampleLights,
                                           bool sampleBSDF, CameraHandle camera,
                                           SamplerHandle sampler,
                                           PrimitiveHandle aggregate,
                                           std::vector<LightHandle> lights)
    : RayIntegrator(camera, sampler, aggregate, lights),
      maxDepth(maxDepth),
      sampleLights(sampleLights),
      sampleBSDF(sampleBSDF),
      lightSampler(lights, Allocator()) {}